

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O1

int readbits(int bitwidth,readblock_crap *crap)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  byte bVar4;
  byte *pbVar6;
  int iVar7;
  int iVar5;
  
  uVar3 = 0;
  if (crap->sourcepos < crap->sourceend) {
    iVar7 = crap->rembits;
    uVar3 = 0;
    if (iVar7 < bitwidth) {
      iVar5 = 0;
      uVar3 = 0;
      pbVar2 = crap->sourcepos;
      do {
        pbVar6 = pbVar2 + 1;
        crap->sourcepos = pbVar6;
        uVar3 = (uint)*pbVar2 << ((byte)iVar5 & 0x1f) | uVar3;
        if (crap->sourceend <= pbVar6) {
          return uVar3;
        }
        iVar5 = iVar5 + iVar7;
        bVar4 = (byte)iVar5;
        bitwidth = bitwidth - iVar7;
        crap->rembits = 8;
        iVar7 = 8;
        pbVar2 = pbVar6;
      } while (8 < bitwidth);
    }
    else {
      bVar4 = 0;
    }
    bVar1 = *crap->sourcepos;
    uVar3 = uVar3 | (~(-1 << ((byte)bitwidth & 0x1f)) & (uint)bVar1) << (bVar4 & 0x1f);
    *crap->sourcepos = bVar1 >> ((byte)bitwidth & 0x1f);
    crap->rembits = crap->rembits - bitwidth;
  }
  return uVar3;
}

Assistant:

static int readbits(int bitwidth, readblock_crap * crap)
{
	int val = 0;
	int b = 0;

	if (crap->sourcepos >= crap->sourceend) return val;

	while (bitwidth > crap->rembits) {
		val |= *crap->sourcepos++ << b;
		if (crap->sourcepos >= crap->sourceend) return val;
		b += crap->rembits;
		bitwidth -= crap->rembits;
		crap->rembits = 8;
	}

	val |= (*crap->sourcepos & ((1 << bitwidth) - 1)) << b;
	*crap->sourcepos >>= bitwidth;
	crap->rembits -= bitwidth;

	return val;
}